

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_panel.cxx
# Opt level: O3

Fl_Double_Window * make_decl_panel(void)

{
  Fl_Input *pFVar1;
  Fl_Double_Window *pFVar2;
  Fl_Group *pFVar3;
  Fl_Widget *pFVar4;
  Fl_Group *pFVar5;
  Fl_Menu_ *pFVar6;
  Fl_Text_Editor *pFVar7;
  Fl_Text_Buffer *this;
  Fl_Window *this_00;
  Fl_Button *this_01;
  
  pFVar2 = (Fl_Double_Window *)operator_new(0xf0);
  Fl_Double_Window::Fl_Double_Window(pFVar2,0x157,0xed,"Declaration Properties");
  decl_panel = pFVar2;
  (pFVar2->super_Fl_Window).super_Fl_Group.super_Fl_Widget.label_.align_ = 0x50;
  pFVar3 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar3,10,10,0x10e,0x14,(char *)0x0);
  pFVar4 = (Fl_Widget *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)pFVar4,200,10,0x50,0x14,(char *)0x0);
  pFVar5 = Fl_Group::current();
  pFVar5->resizable_ = pFVar4;
  pFVar6 = (Fl_Menu_ *)operator_new(0x98);
  Fl_Choice::Fl_Choice((Fl_Choice *)pFVar6,10,10,0xb9,0x14,(char *)0x0);
  decl_choice = (Fl_Choice *)pFVar6;
  pFVar6->down_box_ = '\x0e';
  (pFVar6->super_Fl_Widget).label_.size = 0xb;
  pFVar6->textsize_ = 0xb;
  Fl_Menu_::menu(pFVar6,menu_decl_choice);
  pFVar6 = (Fl_Menu_ *)operator_new(0x98);
  Fl_Choice::Fl_Choice((Fl_Choice *)pFVar6,10,10,0x4b,0x14,(char *)0x0);
  decl_class_choice = (Fl_Choice *)pFVar6;
  pFVar6->down_box_ = '\x0e';
  (pFVar6->super_Fl_Widget).label_.size = 0xb;
  pFVar6->textsize_ = 0xb;
  Fl_Menu_::menu(pFVar6,menu_decl_class_choice);
  Fl_Group::end(pFVar3);
  pFVar4 = (Fl_Widget *)operator_new(200);
  Fl_Input::Fl_Input((Fl_Input *)pFVar4,10,0x28,0x140,0x14,
                     "This can be any declaration, like \"int x;\", an external symbol like \"extern int foo();\", a #directive like \"#include <foo.h>\", a comment like \"//foo\" or \"/*foo*/\", or typedef like \"typedef char byte;\" or \"using std::list;\"."
                    );
  decl_input = (Fl_Input *)pFVar4;
  Fl_Widget::tooltip(pFVar4,"Declaration text.");
  pFVar1 = decl_input;
  (decl_input->super_Fl_Input_).super_Fl_Widget.label_.size = 0xb;
  (pFVar1->super_Fl_Input_).textfont_ = 4;
  (pFVar1->super_Fl_Input_).textsize_ = 0xb;
  (pFVar1->super_Fl_Input_).super_Fl_Widget.label_.align_ = 0x86;
  (pFVar1->super_Fl_Input_).super_Fl_Widget.when_ = '\0';
  pFVar7 = (Fl_Text_Editor *)operator_new(0x1c0);
  Fl_Text_Editor::Fl_Text_Editor(pFVar7,10,0x82,0x140,0x41,"Comment:");
  decl_comment_input = pFVar7;
  Fl_Widget::tooltip((Fl_Widget *)pFVar7,"Declaration comment in Doxygen format");
  pFVar7 = decl_comment_input;
  (decl_comment_input->super_Fl_Text_Display).super_Fl_Group.super_Fl_Widget.box_ = '\x03';
  (pFVar7->super_Fl_Text_Display).super_Fl_Group.super_Fl_Widget.label_.font = 1;
  (pFVar7->super_Fl_Text_Display).super_Fl_Group.super_Fl_Widget.label_.size = 0xb;
  (pFVar7->super_Fl_Text_Display).textfont_ = 4;
  (pFVar7->super_Fl_Text_Display).textsize_ = 0xb;
  (pFVar7->super_Fl_Text_Display).mColumnScale = 0.0;
  (pFVar7->super_Fl_Text_Display).super_Fl_Group.super_Fl_Widget.label_.align_ = 5;
  pFVar3 = Fl_Group::current();
  pFVar7 = decl_comment_input;
  pFVar3->resizable_ = (Fl_Widget *)decl_comment_input;
  this = (Fl_Text_Buffer *)operator_new(0x88);
  Fl_Text_Buffer::Fl_Text_Buffer(this,0,0x400);
  Fl_Text_Display::buffer(&pFVar7->super_Fl_Text_Display,this);
  Fl_Text_Editor::add_key_binding
            (decl_comment_input,0xff09,0,use_tab_navigation,&decl_comment_input->key_bindings);
  pFVar3 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar3,10,0xcd,0x140,0x14,(char *)0x0);
  pFVar4 = (Fl_Widget *)operator_new(0x80);
  Fl_Return_Button::Fl_Return_Button((Fl_Return_Button *)pFVar4,200,0xcd,0x3c,0x14,"OK");
  decl_panel_ok = (Fl_Return_Button *)pFVar4;
  (pFVar4->label_).size = 0xb;
  this_00 = Fl_Widget::window(pFVar4);
  Fl_Window::hotspot(this_00,(Fl_Widget *)decl_panel_ok,0);
  this_01 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(this_01,0x10e,0xcd,0x3c,0x14,"Cancel");
  decl_panel_cancel = this_01;
  this_01->shortcut_ = 0xff1b;
  (this_01->super_Fl_Widget).label_.size = 0xb;
  pFVar4 = (Fl_Widget *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)pFVar4,10,0xcd,0xb9,0x14,(char *)0x0);
  pFVar5 = Fl_Group::current();
  pFVar5->resizable_ = pFVar4;
  Fl_Group::end(pFVar3);
  pFVar2 = decl_panel;
  (pFVar2->super_Fl_Window).minw = 0x157;
  (pFVar2->super_Fl_Window).minh = 0xed;
  (pFVar2->super_Fl_Window).maxw = 0;
  (pFVar2->super_Fl_Window).maxh = 0;
  (pFVar2->super_Fl_Window).dw = 0;
  (pFVar2->super_Fl_Window).dh = 0;
  (pFVar2->super_Fl_Window).aspect = 0;
  Fl_Window::size_range_(&pFVar2->super_Fl_Window);
  Fl_Group::end((Fl_Group *)decl_panel);
  return decl_panel;
}

Assistant:

Fl_Double_Window* make_decl_panel() {
  { decl_panel = new Fl_Double_Window(343, 237, "Declaration Properties");
    decl_panel->align(Fl_Align(FL_ALIGN_CLIP|FL_ALIGN_INSIDE));
    { Fl_Group* o = new Fl_Group(10, 10, 270, 20);
      { Fl_Box* o = new Fl_Box(200, 10, 80, 20);
        Fl_Group::current()->resizable(o);
      } // Fl_Box* o
      { decl_choice = new Fl_Choice(10, 10, 185, 20);
        decl_choice->down_box(FL_BORDER_BOX);
        decl_choice->labelsize(11);
        decl_choice->textsize(11);
        decl_choice->menu(menu_decl_choice);
      } // Fl_Choice* decl_choice
      { decl_class_choice = new Fl_Choice(10, 10, 75, 20);
        decl_class_choice->down_box(FL_BORDER_BOX);
        decl_class_choice->labelsize(11);
        decl_class_choice->textsize(11);
        decl_class_choice->menu(menu_decl_class_choice);
      } // Fl_Choice* decl_class_choice
      o->end();
    } // Fl_Group* o
    { decl_input = new Fl_Input(10, 40, 320, 20, "This can be any declaration, like \"int x;\", an external symbol like \"exter\
n int foo();\", a #directive like \"#include <foo.h>\", a comment like \"//foo\
\" or \"/*foo*/\", or typedef like \"typedef char byte;\" or \"using std::list\
;\".");
      decl_input->tooltip("Declaration text.");
      decl_input->labelsize(11);
      decl_input->textfont(4);
      decl_input->textsize(11);
      decl_input->align(Fl_Align(134));
      decl_input->when(FL_WHEN_NEVER);
    } // Fl_Input* decl_input
    { decl_comment_input = new Fl_Text_Editor(10, 130, 320, 65, "Comment:");
      decl_comment_input->tooltip("Declaration comment in Doxygen format");
      decl_comment_input->box(FL_DOWN_BOX);
      decl_comment_input->labelfont(1);
      decl_comment_input->labelsize(11);
      decl_comment_input->textfont(4);
      decl_comment_input->textsize(11);
      decl_comment_input->align(Fl_Align(FL_ALIGN_TOP_LEFT));
      Fl_Group::current()->resizable(decl_comment_input);
      decl_comment_input->buffer(new Fl_Text_Buffer());
      decl_comment_input->add_key_binding(FL_Tab, 0, use_tab_navigation);
    } // Fl_Text_Editor* decl_comment_input
    { Fl_Group* o = new Fl_Group(10, 205, 320, 20);
      { decl_panel_ok = new Fl_Return_Button(200, 205, 60, 20, "OK");
        decl_panel_ok->labelsize(11);
        decl_panel_ok->window()->hotspot(decl_panel_ok);
      } // Fl_Return_Button* decl_panel_ok
      { decl_panel_cancel = new Fl_Button(270, 205, 60, 20, "Cancel");
        decl_panel_cancel->shortcut(0xff1b);
        decl_panel_cancel->labelsize(11);
      } // Fl_Button* decl_panel_cancel
      { Fl_Box* o = new Fl_Box(10, 205, 185, 20);
        Fl_Group::current()->resizable(o);
      } // Fl_Box* o
      o->end();
    } // Fl_Group* o
    decl_panel->size_range(343, 237);
    decl_panel->end();
  } // Fl_Double_Window* decl_panel
  return decl_panel;
}